

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O0

void leveldb::_Test_NoLogFiles::_RunIt(void)

{
  undefined1 local_38 [8];
  _Test_NoLogFiles t;
  
  _Test_NoLogFiles((_Test_NoLogFiles *)local_38);
  _Run((_Test_NoLogFiles *)local_38);
  ~_Test_NoLogFiles((_Test_NoLogFiles *)local_38);
  return;
}

Assistant:

TEST(RecoveryTest, NoLogFiles) {
  ASSERT_OK(Put("foo", "bar"));
  ASSERT_EQ(1, DeleteLogFiles());
  Open();
  ASSERT_EQ("NOT_FOUND", Get("foo"));
  Open();
  ASSERT_EQ("NOT_FOUND", Get("foo"));
}